

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O3

Word32 pow2(tetra_codec *st,Word16 exponant,Word16 fraction)

{
  uint uVar1;
  Word32 WVar2;
  ushort uVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined6 in_register_00000012;
  ulong uVar8;
  short sVar9;
  
  uVar8 = CONCAT62(in_register_00000012,fraction);
  uVar3 = 7;
  while( true ) {
    uVar6 = (uint)uVar8;
    if (0x3fffffff < (int)uVar6) {
      uVar1 = 0x7fffffff;
      sVar4 = 0x7fff;
      goto LAB_00108020;
    }
    if ((int)uVar6 < -0x40000000) break;
    uVar1 = uVar6 * 2;
    uVar8 = (ulong)uVar1;
    uVar3 = uVar3 - 1;
    if (uVar3 < 2) {
      sVar4 = (short)(uVar1 >> 0x10);
      if (-1 < (int)uVar6) {
LAB_00108020:
        uVar6 = uVar1 >> 1;
      }
LAB_0010802f:
      uVar3 = tab_pow2[sVar4];
      sVar4 = tab_pow2[(long)sVar4 + 1];
      sVar9 = uVar3 - sVar4;
      if (SBORROW2(uVar3,sVar4)) {
        sVar9 = (-1 < (short)(uVar3 - sVar4)) + 0x7fff;
      }
      uVar5 = (uint)uVar3 * 0x10000;
      uVar1 = (uVar6 * 2 & 0xffff) * (int)sVar9;
      uVar7 = uVar5 - uVar1;
      uVar6 = 0x7fffffff;
      if (-1 < (int)((uVar1 ^ uVar5) & (uVar5 ^ uVar7))) {
        uVar6 = uVar7;
      }
      if (exponant < -0x7fe1) {
        st->Overflow = 1;
        WVar2 = 0;
      }
      else {
        st->Overflow = 0;
        WVar2 = 0;
        if (-2 < exponant) {
          WVar2 = L_shr(st,uVar6,0x1e - exponant);
          if (exponant < 0x1e) {
            WVar2 = WVar2 + (uint)((uVar6 >> (0x1d - (ushort)exponant & 0x1f) & 1) != 0);
          }
        }
      }
      return WVar2;
    }
  }
  uVar6 = 0;
  sVar4 = -0x8000;
  goto LAB_0010802f;
}

Assistant:

Word32 pow2(tetra_codec* st, Word16 exponant, Word16 fraction)
{
  Word16 exp, i, a, tmp;
  Word32 L_x;

  L_x = L_deposit_l(fraction);
  L_x = L_shl(st, L_x, (Word16)6 );
  i   = extract_h(L_x);				/* Extract b10-b16 of fraction */
  L_x = L_shr(st, L_x, (Word16)1 );
  a   = extract_l(L_x);				/* Extract b0-b9   of fraction */
  a   = a & (Word16)0x7fff;


  L_x = L_deposit_h(tab_pow2[i]);		/* tab_pow2[i] << 16 */
  tmp = sub(st, tab_pow2[i], tab_pow2[i+1]);	/* tab_pow2[i] - tab_pow2[i+1] */
  L_x = L_msu(st, L_x, tmp, a);			/* L_x -= tmp*a*2  */

  exp = sub(st,  (Word16)30, exponant );
  L_x = L_shr_r(st, L_x, exp);
  return(L_x);
}